

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple.cpp
# Opt level: O2

void __thiscall iu_ProdTest_x_iutest_x_Peep_Test::Body(iu_ProdTest_x_iutest_x_Peep_Test *this)

{
  int *in_R9;
  ProdClass c;
  AssertionResult iutest_ar;
  iuCodeMessage local_1c0;
  Fixed local_190;
  
  c.m_x = 100;
  local_190.super_Message.m_stream.super_iu_stringstream._0_4_ = c.m_x;
  iutest::internal::CmpHelperEQ<int,int>
            (&iutest_ar,(internal *)0x1fcdea,
             "(c.*::iutest::detail::peep_tag< iu_peep_tag_m_x<ProdClass> >::value)",
             (char *)&local_190,
             (int *)((long)&c.m_x + iutest::detail::peep_tag<iu_peep_tag_m_x<ProdClass>>::value),
             in_R9);
  if (iutest_ar.m_result == false) {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/samples/simple.cpp"
               ,0x9f,iutest_ar.m_message._M_dataplus._M_p);
    local_1c0._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c0,&local_190);
    std::__cxx11::string::~string((string *)&local_1c0);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  return;
}

Assistant:

IUTEST(ProdTest, Peep)
{
    ProdClass c;
    IUTEST_ASSERT_EQ(100, IUTEST_PEEP_GET(c, ProdClass, m_x));
}